

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.hpp
# Opt level: O1

EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
* __thiscall
EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
::Chain<ConstantSolver>
          (EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
           *this)

{
  _Head_base<0UL,_EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
  _Var1;
  bool bVar2;
  tuple<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
  tVar3;
  EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *unaff_R14;
  
  bVar2 = false;
  while (_Var1._M_head_impl =
              (this->nextSolver)._M_t.
              super___uniq_ptr_impl<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::default_delete<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
              .
              super__Head_base<0UL,_EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
              ._M_head_impl,
        _Var1._M_head_impl !=
        (EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
         *)0x0) {
    if (!bVar2) {
      unaff_R14 = this;
    }
    bVar2 = true;
    this = _Var1._M_head_impl;
  }
  tVar3.
  super__Tuple_impl<0UL,_EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
  .
  super__Head_base<0UL,_EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
        )operator_new(0x10);
  *(undefined8 *)
   tVar3.
   super__Tuple_impl<0UL,_EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
   .
   super__Head_base<0UL,_EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
   ._M_head_impl = 0;
  *(undefined8 *)
   ((long)tVar3.
          super__Tuple_impl<0UL,_EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
          .
          super__Head_base<0UL,_EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
          ._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)tVar3.
          super__Tuple_impl<0UL,_EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
          .
          super__Head_base<0UL,_EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
          ._M_head_impl + 8) = 0;
  *(undefined ***)
   tVar3.
   super__Tuple_impl<0UL,_EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
   .
   super__Head_base<0UL,_EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
   ._M_head_impl = &PTR__EquationSolver_0011aba8;
  (this->nextSolver)._M_t.
  super___uniq_ptr_impl<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::default_delete<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
       = tVar3.
         super__Tuple_impl<0UL,_EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_std::default_delete<EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
         .
         super__Head_base<0UL,_EquationSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_*,_false>
         ._M_head_impl;
  if (!bVar2) {
    unaff_R14 = this;
  }
  return unaff_R14;
}

Assistant:

EquationSolver *Chain() {
        if (nextSolver) {
            nextSolver->template Chain<NextSolverType>();
        } else {
            nextSolver = std::make_unique<NextSolverType<ValueType> >();
        }
        return this;
    }